

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O0

void __thiscall
spvtools::opt::IRContext::AddCalls
          (IRContext *this,Function *func,
          queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *todo)

{
  UnderlyingIterator UVar1;
  bool bVar2;
  Op OVar3;
  Instruction *pIVar4;
  uint32_t local_70;
  uint32_t local_6c;
  int local_68;
  uint32_t tensor_operands_index;
  uint32_t count;
  uint32_t mask;
  int memory_operands_index;
  uint32_t local_54;
  undefined1 local_50 [16];
  iterator ii;
  undefined1 local_30 [8];
  const_iterator bi;
  queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *todo_local;
  Function *func_local;
  IRContext *this_local;
  
  bi.iterator_._M_current =
       (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *)
       todo;
  _local_30 = opt::Function::begin(func);
  while( true ) {
    _ii = opt::Function::end(func);
    bVar2 = UptrVectorIterator<spvtools::opt::BasicBlock,_true>::operator!=
                      ((UptrVectorIterator<spvtools::opt::BasicBlock,_true> *)local_30,
                       (UptrVectorIterator<spvtools::opt::BasicBlock,_true> *)&ii);
    if (!bVar2) break;
    UptrVectorIterator<spvtools::opt::BasicBlock,_true>::operator->
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_true> *)local_30);
    BasicBlock::begin((BasicBlock *)(local_50 + 8));
    while( true ) {
      UptrVectorIterator<spvtools::opt::BasicBlock,_true>::operator->
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_true> *)local_30);
      BasicBlock::end((BasicBlock *)local_50);
      bVar2 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)(local_50 + 8),
                                (iterator_template<spvtools::opt::Instruction> *)local_50);
      if (!bVar2) break;
      pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)(local_50 + 8));
      OVar3 = opt::Instruction::opcode(pIVar4);
      UVar1 = bi.iterator_;
      if (OVar3 == OpFunctionCall) {
        pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator->
                           ((iterator_template<spvtools::opt::Instruction> *)(local_50 + 8));
        local_54 = opt::Instruction::GetSingleWordInOperand(pIVar4,0);
        std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
                  ((queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   UVar1._M_current,&local_54);
      }
      pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)(local_50 + 8));
      OVar3 = opt::Instruction::opcode(pIVar4);
      UVar1 = bi.iterator_;
      if (OVar3 == OpCooperativeMatrixPerElementOpNV) {
        pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator->
                           ((iterator_template<spvtools::opt::Instruction> *)(local_50 + 8));
        memory_operands_index = opt::Instruction::GetSingleWordInOperand(pIVar4,1);
        std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
                  ((queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   UVar1._M_current,(value_type *)&memory_operands_index);
      }
      pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)(local_50 + 8));
      OVar3 = opt::Instruction::opcode(pIVar4);
      UVar1 = bi.iterator_;
      if (OVar3 == OpCooperativeMatrixReduceNV) {
        pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator->
                           ((iterator_template<spvtools::opt::Instruction> *)(local_50 + 8));
        mask = opt::Instruction::GetSingleWordInOperand(pIVar4,2);
        std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
                  ((queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   UVar1._M_current,&mask);
      }
      pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)(local_50 + 8));
      OVar3 = opt::Instruction::opcode(pIVar4);
      if (OVar3 == OpCooperativeMatrixLoadTensorNV) {
        count = 3;
        pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator->
                           ((iterator_template<spvtools::opt::Instruction> *)(local_50 + 8));
        tensor_operands_index = opt::Instruction::GetSingleWordInOperand(pIVar4,3);
        local_68 = 1;
        if ((tensor_operands_index & 2) != 0) {
          local_68 = 2;
        }
        if ((tensor_operands_index & 8) != 0) {
          local_68 = local_68 + 1;
        }
        if ((tensor_operands_index & 0x10) != 0) {
          local_68 = local_68 + 1;
        }
        local_6c = local_68 + 3;
        pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator->
                           ((iterator_template<spvtools::opt::Instruction> *)(local_50 + 8));
        tensor_operands_index = opt::Instruction::GetSingleWordInOperand(pIVar4,local_6c);
        UVar1 = bi.iterator_;
        local_68 = 1;
        if ((tensor_operands_index & 1) != 0) {
          local_68 = 2;
        }
        if ((tensor_operands_index & 2) != 0) {
          pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
                   iterator_template<spvtools::opt::Instruction>::operator->
                             ((iterator_template<spvtools::opt::Instruction> *)(local_50 + 8));
          local_70 = opt::Instruction::GetSingleWordInOperand(pIVar4,local_6c + local_68);
          std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
                    ((queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)UVar1._M_current,&local_70);
        }
      }
      InstructionList::iterator::operator++((iterator *)(local_50 + 8));
    }
    UptrVectorIterator<spvtools::opt::BasicBlock,_true>::operator++
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_true> *)local_30);
  }
  return;
}

Assistant:

void IRContext::AddCalls(const Function* func, std::queue<uint32_t>* todo) {
  for (auto bi = func->begin(); bi != func->end(); ++bi)
    for (auto ii = bi->begin(); ii != bi->end(); ++ii) {
      if (ii->opcode() == spv::Op::OpFunctionCall)
        todo->push(ii->GetSingleWordInOperand(0));
      if (ii->opcode() == spv::Op::OpCooperativeMatrixPerElementOpNV)
        todo->push(ii->GetSingleWordInOperand(1));
      if (ii->opcode() == spv::Op::OpCooperativeMatrixReduceNV)
        todo->push(ii->GetSingleWordInOperand(2));
      if (ii->opcode() == spv::Op::OpCooperativeMatrixLoadTensorNV) {
        const auto memory_operands_index = 3;
        auto mask = ii->GetSingleWordInOperand(memory_operands_index);

        uint32_t count = 1;
        if (mask & uint32_t(spv::MemoryAccessMask::Aligned)) ++count;
        if (mask & uint32_t(spv::MemoryAccessMask::MakePointerAvailableKHR))
          ++count;
        if (mask & uint32_t(spv::MemoryAccessMask::MakePointerVisibleKHR))
          ++count;

        const auto tensor_operands_index = memory_operands_index + count;
        mask = ii->GetSingleWordInOperand(tensor_operands_index);
        count = 1;
        if (mask & uint32_t(spv::TensorAddressingOperandsMask::TensorView))
          ++count;

        if (mask & uint32_t(spv::TensorAddressingOperandsMask::DecodeFunc)) {
          todo->push(ii->GetSingleWordInOperand(tensor_operands_index + count));
        }
      }
    }
}